

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O1

unique_ptr<duckdb::PhysicalResultCollector,_std::default_delete<duckdb::PhysicalResultCollector>,_true>
 __thiscall
duckdb::
make_uniq_base<duckdb::PhysicalResultCollector,duckdb::PhysicalArrowCollector,duckdb::PreparedStatementData&,bool,unsigned_long&>
          (duckdb *this,PreparedStatementData *args,bool *args_1,unsigned_long *args_2)

{
  bool bVar1;
  _func_int **pp_Var2;
  PhysicalResultCollector *this_00;
  
  this_00 = (PhysicalResultCollector *)operator_new(0x140);
  bVar1 = *args_1;
  pp_Var2 = (_func_int **)*args_2;
  PhysicalResultCollector::PhysicalResultCollector(this_00,args);
  (this_00->super_PhysicalOperator)._vptr_PhysicalOperator =
       (_func_int **)&PTR__PhysicalResultCollector_019bd478;
  this_00[1].super_PhysicalOperator._vptr_PhysicalOperator = pp_Var2;
  this_00[1].super_PhysicalOperator.type = bVar1;
  *(PhysicalResultCollector **)this = this_00;
  return (unique_ptr<duckdb::PhysicalResultCollector,_std::default_delete<duckdb::PhysicalResultCollector>_>
          )(unique_ptr<duckdb::PhysicalResultCollector,_std::default_delete<duckdb::PhysicalResultCollector>_>
            )this;
}

Assistant:

unique_ptr<S> make_uniq_base(ARGS &&... args) { // NOLINT: mimic std style
	return unique_ptr<S>(new T(std::forward<ARGS>(args)...));
}